

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O0

uint32_t __thiscall ast::Section::read32(Section *this,uint offset)

{
  uint local_24;
  uint local_20;
  uint32_t byte3;
  uint32_t byte2;
  uint32_t byte1;
  uint32_t byte0;
  uint offset_local;
  Section *this_local;
  
  byte2 = 0x55;
  byte3 = 0x55;
  local_20 = 0x55;
  local_24 = 0x55;
  if (offset < this->content_size) {
    byte2 = (uint32_t)this->content[offset];
  }
  if (offset + 1 < this->content_size) {
    byte3 = (uint32_t)this->content[(ulong)offset + 1];
  }
  if (offset + 2 < this->content_size) {
    local_20 = (uint)this->content[(ulong)offset + 2];
  }
  if (offset + 3 < this->content_size) {
    local_24 = (uint)this->content[(ulong)offset + 3];
  }
  return local_24 * 0x1000000 + local_20 * 0x10000 + byte3 * 0x100 + byte2;
}

Assistant:

uint32_t Section::read32(unsigned offset)
{
	uint32_t byte0 = 0x55, byte1 = 0x55, byte2 = 0x55, byte3 = 0x55;
	if (offset < content_size)
		byte0 = *(content + offset);
	if (offset + 1 < content_size)
		byte1 = *(content + offset + 1);
	if (offset + 2 < content_size)
		byte2 = *(content + offset + 2);
	if (offset + 3 < content_size)
		byte3 = *(content + offset + 3);
	return (byte3 << 24) + (byte2 << 16) + (byte1 << 8) + byte0;
}